

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdEncodeSignatureByDer
              (void *handle,char *signature,int sighash_type,bool sighash_anyone_can_pay,
              char **der_signature)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  CfdException *pCVar5;
  ByteData der_sig;
  SigHashType type;
  undefined1 local_78 [32];
  ByteData local_58;
  SigHashType local_3c;
  
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(signature);
  if (bVar2) {
    local_78._0_8_ = "cfdcapi_key.cpp";
    local_78._8_4_ = 0x389;
    local_78._16_8_ = "CfdEncodeSignatureByDer";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (signature != (char *)0x0) {
    cfd::core::SigHashType::Create(&local_3c,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    pcVar1 = local_78 + 0x10;
    local_78._0_8_ = pcVar1;
    sVar3 = strlen(signature);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,signature,signature + sVar3);
    cfd::core::CryptoUtil::ConvertSignatureToDer(&local_58,(string *)local_78,&local_3c);
    if ((pointer)local_78._0_8_ != pcVar1) {
      operator_delete((void *)local_78._0_8_);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_78,&local_58);
    pcVar4 = cfd::capi::CreateString((string *)local_78);
    *der_signature = pcVar4;
    if ((pointer)local_78._0_8_ != pcVar1) {
      operator_delete((void *)local_78._0_8_);
    }
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_78._0_8_ = "cfdcapi_key.cpp";
  local_78._8_4_ = 0x38f;
  local_78._16_8_ = "CfdEncodeSignatureByDer";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"der_signature is null.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Failed to parameter. der_signature is null.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdEncodeSignatureByDer(
    void* handle, const char* signature, int sighash_type,
    bool sighash_anyone_can_pay, char** der_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "der_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null.");
    }

    SigHashType type = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData der_sig = CryptoUtil::ConvertSignatureToDer(signature, type);
    *der_signature = CreateString(der_sig.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}